

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildingState.cpp
# Opt level: O2

void BuildingState::CmdSetShortDesc
               (string *input,shared_ptr<Connection> *connection,shared_ptr<GameData> *game_data)

{
  shared_ptr<Room> room;
  shared_ptr<Player> player;
  undefined1 local_30 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  Connection::GetPlayer((Connection *)(local_30 + 0x10));
  Entity::GetRoom((Entity *)local_30);
  Room::SetShortDesc((Room *)local_30._0_8_,input);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_30 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  return;
}

Assistant:

void BuildingState::CmdSetShortDesc(const std::string &input, std::shared_ptr<Connection> connection,
                                    std::shared_ptr<GameData> game_data) {
    auto player = connection->GetPlayer();
    auto room = player->GetRoom();
    room->SetShortDesc(input);
}